

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring_bitmap_statistics(roaring_bitmap_t *r,roaring_statistics_t *stat)

{
  uint8_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  int32_t iVar4;
  int *in_RSI;
  int *in_RDI;
  uint32_t sbytes;
  uint32_t card;
  uint8_t truetype;
  int i;
  roaring_array_t *ra;
  container_t *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_1c;
  
  memset(in_RSI,0,0x40);
  *in_RSI = *in_RDI;
  uVar2 = roaring_bitmap_minimum
                    ((roaring_bitmap_t *)
                     CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  in_RSI[0xb] = uVar2;
  uVar2 = roaring_bitmap_maximum
                    ((roaring_bitmap_t *)
                     CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  in_RSI[10] = uVar2;
  for (local_1c = 0; local_1c < *in_RDI; local_1c = local_1c + 1) {
    uVar1 = get_container_type(*(container_t **)(*(long *)(in_RDI + 2) + (long)local_1c * 8),
                               *(uint8_t *)(*(long *)(in_RDI + 6) + (long)local_1c));
    uVar3 = container_get_cardinality(in_stack_ffffffffffffffc8,'\0');
    iVar4 = container_size_in_bytes(in_stack_ffffffffffffffc8,'\0');
    *(ulong *)(in_RSI + 0xe) = *(long *)(in_RSI + 0xe) + (ulong)uVar3;
    if (uVar1 == '\x01') {
      in_RSI[3] = in_RSI[3] + 1;
      in_RSI[6] = uVar3 + in_RSI[6];
      in_RSI[9] = iVar4 + in_RSI[9];
    }
    else if (uVar1 == '\x02') {
      in_RSI[1] = in_RSI[1] + 1;
      in_RSI[4] = uVar3 + in_RSI[4];
      in_RSI[7] = iVar4 + in_RSI[7];
    }
    else {
      in_RSI[2] = in_RSI[2] + 1;
      in_RSI[5] = uVar3 + in_RSI[5];
      in_RSI[8] = iVar4 + in_RSI[8];
    }
  }
  return;
}

Assistant:

void roaring_bitmap_statistics(const roaring_bitmap_t *r,
                               roaring_statistics_t *stat) {
    const roaring_array_t *ra = &r->high_low_container;

    memset(stat, 0, sizeof(*stat));
    stat->n_containers = ra->size;
    stat->min_value = roaring_bitmap_minimum(r);
    stat->max_value = roaring_bitmap_maximum(r);

    for (int i = 0; i < ra->size; ++i) {
        uint8_t truetype =
            get_container_type(ra->containers[i], ra->typecodes[i]);
        uint32_t card =
            container_get_cardinality(ra->containers[i], ra->typecodes[i]);
        uint32_t sbytes =
            container_size_in_bytes(ra->containers[i], ra->typecodes[i]);
        stat->cardinality += card;
        switch (truetype) {
            case BITSET_CONTAINER_TYPE:
                stat->n_bitset_containers++;
                stat->n_values_bitset_containers += card;
                stat->n_bytes_bitset_containers += sbytes;
                break;
            case ARRAY_CONTAINER_TYPE:
                stat->n_array_containers++;
                stat->n_values_array_containers += card;
                stat->n_bytes_array_containers += sbytes;
                break;
            case RUN_CONTAINER_TYPE:
                stat->n_run_containers++;
                stat->n_values_run_containers += card;
                stat->n_bytes_run_containers += sbytes;
                break;
            default:
                assert(false);
                roaring_unreachable;
        }
    }
}